

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

bool glcts::verifyFace<unsigned_int,1u,3u,3u>
               (uint *data,GLuint cube_face,uint *expected_values,GLuint image_width)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  
  bVar6 = false;
  uVar5 = 0;
  do {
    lVar3 = 0;
    do {
      bVar2 = true;
      do {
        bVar1 = bVar2;
        if (!bVar1) {
          iVar4 = 0;
          goto LAB_00d8a9a1;
        }
        bVar2 = false;
      } while (data[uVar5 * image_width + cube_face * 3 + (int)lVar3] ==
               expected_values[uVar5 * 3 + cube_face * 9 + (int)lVar3]);
      iVar4 = 1;
LAB_00d8a9a1:
      if (bVar1) goto LAB_00d8a9b5;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    iVar4 = 5;
LAB_00d8a9b5:
    if ((iVar4 != 5) && (iVar4 != 0)) {
      return bVar6;
    }
    bVar6 = 1 < uVar5;
    uVar5 = uVar5 + 1;
    if (uVar5 == 3) {
      return bVar6;
    }
  } while( true );
}

Assistant:

bool verifyFace(const T* data, const glw::GLuint cube_face, const T* expected_values, const glw::GLuint image_width)
{
	static const glw::GLuint size_of_pixel = N_Components;

	const glw::GLuint data_face_offset  = N_Components * Width * cube_face;
	const glw::GLuint exp_face_offset   = N_Components * Width * Height * cube_face;
	const glw::GLuint data_size_of_line = image_width * size_of_pixel;
	const glw::GLuint exp_size_of_line  = Width * size_of_pixel;

	for (glw::GLuint y = 0; y < Height; ++y)
	{
		const glw::GLuint data_line_offset = y * data_size_of_line;
		const glw::GLuint exp_line_offset  = y * exp_size_of_line;

		for (glw::GLuint x = 0; x < Width; ++x)
		{
			const glw::GLuint data_pixel_offset = data_line_offset + data_face_offset + x * size_of_pixel;
			const glw::GLuint exp_pixel_offset  = exp_line_offset + exp_face_offset + x * size_of_pixel;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (data[data_pixel_offset + component] != expected_values[exp_pixel_offset + component])
				{
					return false;
				}
			}
		}
	}

	return true;
}